

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

ALLEGRO_THREAD *
al_create_thread_with_stacksize
          (_func_void_ptr_ALLEGRO_THREAD_ptr_void_ptr *proc,void *arg,size_t stacksize)

{
  ALLEGRO_THREAD *pAVar1;
  void *in_RSI;
  void *in_RDI;
  ALLEGRO_THREAD *outer;
  _func_void__AL_THREAD_ptr_void_ptr *in_stack_00000028;
  _AL_THREAD *in_stack_00000030;
  
  pAVar1 = create_thread();
  pAVar1->thread_state = THREAD_STATE_CREATED;
  _al_mutex_init((_AL_MUTEX *)0x17f1da);
  _al_cond_init((_AL_COND *)0x17f1e8);
  pAVar1->arg = in_RSI;
  pAVar1->proc = in_RDI;
  _al_thread_create_with_stacksize(in_stack_00000030,in_stack_00000028,proc,(size_t)arg);
  return pAVar1;
}

Assistant:

ALLEGRO_THREAD *al_create_thread_with_stacksize(
   void *(*proc)(ALLEGRO_THREAD *thread, void *arg), void *arg, size_t stacksize)
{
   ALLEGRO_THREAD *outer = create_thread();
   outer->thread_state = THREAD_STATE_CREATED;
   _al_mutex_init(&outer->mutex);
   _al_cond_init(&outer->cond);
   outer->arg = arg;
   outer->proc = proc;
   _al_thread_create_with_stacksize(&outer->thread, thread_func_trampoline, outer, stacksize);
   /* XXX _al_thread_create should return an error code */
   return outer;
}